

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O1

void __thiscall
MPEGStreamReader::updateFPS
          (MPEGStreamReader *this,void *curNALUnit,uint8_t *buff,uint8_t *nextNal,int oldSPSLen)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  long lVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  double fps;
  double dVar5;
  
  (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader
    [0x19])();
  dVar5 = correctFps(fps);
  dVar1 = this->m_fps;
  if ((((dVar5 != 0.0) || (NAN(dVar5))) || (dVar1 != 0.0)) || (NAN(dVar1))) {
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        if (5e-05 < (double)(~-(ulong)(dVar1 < dVar5) & (ulong)(dVar1 - dVar5) |
                            (ulong)(dVar5 - dVar1) & -(ulong)(dVar1 < dVar5))) {
          if (this->m_isFirstFpsWarn == true) {
            iVar2 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                      _vptr_BaseAbstractStreamReader[0xd])(this);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,
                                *(char **)(CONCAT44(extraout_var_01,iVar2) + 8),
                                *(long *)(CONCAT44(extraout_var_01,iVar2) + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3," manual defined fps doesn\'t equal to stream fps. Change ",0x38);
            iVar2 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                      _vptr_BaseAbstractStreamReader[0xd])(this);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,*(char **)(CONCAT44(extraout_var_02,iVar2) + 8),
                                *(long *)(CONCAT44(extraout_var_02,iVar2) + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," fps from ",10);
            poVar3 = std::ostream::_M_insert<double>(dVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," to ",4);
            poVar3 = std::ostream::_M_insert<double>(this->m_fps);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            sLastMsg = true;
            this->m_isFirstFpsWarn = false;
          }
          (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x1a])(this,curNALUnit,buff,nextNal,oldSPSLen);
          goto LAB_001bf36d;
        }
      }
      if (((dVar5 == 0.0) && (!NAN(dVar5))) && (this->m_isFirstFpsWarn == true)) {
        iVar2 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                  _vptr_BaseAbstractStreamReader[0xd])(this);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)(CONCAT44(extraout_var_03,iVar2) + 8),
                            *(long *)(CONCAT44(extraout_var_03,iVar2) + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3," stream doesn\'t contain fps field. Muxing fps=",0x2e);
        poVar3 = std::ostream::_M_insert<double>(this->m_fps);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        sLastMsg = true;
        this->m_isFirstFpsWarn = false;
      }
      goto LAB_001bf36d;
    }
    lVar4 = 0;
    if (0.0 < dVar5) {
      lVar4 = (long)(5292000000.0 / dVar5);
    }
    this->m_fps = dVar5;
    this->m_pcrIncPerFrame = lVar4;
    this->m_pcrIncPerField = lVar4 / 2;
    iVar2 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
              _vptr_BaseAbstractStreamReader[0xd])(this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)(CONCAT44(extraout_var_00,iVar2) + 8),
                        *(long *)(CONCAT44(extraout_var_00,iVar2) + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," muxing fps is not set. Get fps from stream. Value: ",0x34);
    poVar3 = std::ostream::_M_insert<double>(dVar5);
    lVar4 = *(long *)poVar3;
  }
  else {
    this->m_fps = 25.0;
    this->m_pcrIncPerFrame = 0xc9dfb00;
    this->m_pcrIncPerField = 0x64efd80;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"This ",5);
    iVar2 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
              _vptr_BaseAbstractStreamReader[0xd])(this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)(CONCAT44(extraout_var,iVar2) + 8),
                        *(long *)(CONCAT44(extraout_var,iVar2) + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               " stream doesn\'t contain fps value. Muxing fps is absent too. Set muxing FPS to default 25.0 value."
               ,0x62);
    lVar4 = *(long *)poVar3;
  }
  std::ios::widen((char)*(undefined8 *)(lVar4 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  sLastMsg = true;
LAB_001bf36d:
  (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader
    [0x1b])(this,curNALUnit,buff,nextNal,oldSPSLen);
  return;
}

Assistant:

void MPEGStreamReader::updateFPS(void* curNALUnit, uint8_t* buff, uint8_t* nextNal, const int oldSPSLen)
{
    double spsFps = getStreamFPS(curNALUnit);
    spsFps = correctFps(spsFps);
    if (spsFps == 0.0 && m_fps == 0.0)
    {
        setFPS(25.0);
        LTRACE(LT_INFO, 2,
               "This " << getCodecInfo().displayName
                       << " stream doesn't contain fps value. Muxing fps is absent too. Set muxing FPS to default 25.0 "
                          "value.");
    }
    else if (m_fps == 0.0)
    {
        setFPS(spsFps);
        LTRACE(LT_INFO, 2,
               getCodecInfo().displayName << " muxing fps is not set. Get fps from stream. Value: " << spsFps);
    }
    else if (spsFps != 0.0 && abs_(m_fps, spsFps) > EPSILON)
    {
        if (m_isFirstFpsWarn)
        {
            LTRACE(LT_INFO, 2,
                   getCodecInfo().displayName << " manual defined fps doesn't equal to stream fps. Change "
                                              << getCodecInfo().displayName << " fps from " << spsFps << " to "
                                              << m_fps);
            m_isFirstFpsWarn = false;
        }
        updateStreamFps(curNALUnit, buff, nextNal, oldSPSLen);
    }
    else if (spsFps == 0.0)
    {
        if (m_isFirstFpsWarn)
        {
            LTRACE(LT_INFO, 2, getCodecInfo().displayName << " stream doesn't contain fps field. Muxing fps=" << m_fps);
            m_isFirstFpsWarn = false;
        }
    }
    updateStreamAR(curNALUnit, buff, nextNal, oldSPSLen);
}